

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  byte bVar2;
  uchar **ppuVar3;
  uchar *puVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint extraout_EDX;
  long lVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  uchar *puVar21;
  uint uVar22;
  uchar **ppuStack_20098;
  uchar **hash_table [16384];
  uchar *local_58;
  uchar *local_40;
  uint local_38;
  int local_34;
  
  local_38 = 0;
  local_34 = 0;
  local_40 = (uchar *)0x0;
  uVar7 = 5;
  if (5 < quality) {
    uVar7 = (ulong)(uint)quality;
  }
  stbiw__sbgrowf(&local_40,1,(int)out_len);
  iVar10 = *(int *)(local_40 + -4);
  iVar11 = iVar10 + 1;
  *(int *)(local_40 + -4) = iVar11;
  local_40[iVar10] = 'x';
  if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1)) {
    stbiw__sbgrowf(&local_40,1,iVar11);
  }
  iVar10 = *(int *)(local_40 + -4);
  *(int *)(local_40 + -4) = iVar10 + 1;
  local_40[iVar10] = '^';
  local_38 = 1;
  local_34 = 1;
  local_40 = stbiw__zlib_flushf(local_40,&local_38,&local_34);
  local_38 = local_38 | 1 << ((byte)local_34 & 0x1f);
  local_34 = local_34 + 2;
  local_58 = stbiw__zlib_flushf(local_40,&local_38,&local_34);
  uVar22 = 0;
  local_40 = local_58;
  memset(&ppuStack_20098,0,0x20000);
  if (3 < data_len) {
    uVar22 = 0;
    do {
      lVar13 = (long)(int)uVar22;
      uVar6 = (uint)CONCAT12(data[lVar13 + 2],*(undefined2 *)(data + lVar13)) * 8 ^
              (uint)CONCAT12(data[lVar13 + 2],*(undefined2 *)(data + lVar13));
      uVar6 = (uVar6 >> 5) + uVar6;
      uVar6 = uVar6 * 0x10 ^ uVar6;
      uVar6 = (uVar6 >> 0x11) + uVar6;
      uVar18 = (ulong)((uVar6 >> 6) + uVar6 & 0x3fff);
      ppuVar3 = hash_table[uVar18 - 1];
      uVar6 = 0;
      if (ppuVar3 != (uchar **)0x0) {
        uVar6 = *(uint *)((long)ppuVar3 + -4);
      }
      pbVar1 = data + lVar13;
      if ((int)uVar6 < 1) {
        iVar10 = 3;
        puVar21 = (uchar *)0x0;
        uVar12 = uVar22;
      }
      else {
        uVar12 = data_len - uVar22;
        uVar15 = uVar12 - 1;
        if (0x100 < uVar15) {
          uVar15 = 0x101;
        }
        iVar10 = 3;
        uVar17 = 0;
        puVar21 = (uchar *)0x0;
        do {
          puVar4 = ppuVar3[uVar17];
          if ((long)(int)(uVar22 - 0x8000) < (long)puVar4 - (long)data) {
            uVar20 = 0;
            if (0 < (int)uVar12) {
              do {
                if (puVar4[uVar20] != pbVar1[uVar20]) goto LAB_0010de41;
                uVar20 = uVar20 + 1;
              } while (uVar15 + 1 != uVar20);
              uVar20 = (ulong)(uVar15 + 1);
            }
LAB_0010de41:
            iVar19 = (int)uVar20;
            iVar11 = iVar10;
            if (iVar10 < iVar19) {
              iVar11 = iVar19;
            }
            bVar5 = iVar10 <= iVar19;
            iVar10 = iVar11;
            if (bVar5) {
              puVar21 = puVar4;
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar6);
      }
      if (ppuVar3 == (uchar **)0x0) {
LAB_0010dea9:
        stbiw__sbgrowf(hash_table + (uVar18 - 1),8,uVar12);
      }
      else {
        if (*(int *)((long)ppuVar3 + -4) == (int)uVar7 * 2) {
          memmove(ppuVar3,ppuVar3 + uVar7,uVar7 * 8);
          *(int *)((long)ppuVar3 + -4) = (int)uVar7;
          uVar12 = extraout_EDX;
        }
        if ((ppuVar3 == (uchar **)0x0) ||
           (*(int *)(ppuVar3 + -1) <= *(int *)((long)ppuVar3 + -4) + 1)) goto LAB_0010dea9;
      }
      ppuVar3 = hash_table[uVar18 - 1];
      iVar11 = *(int *)((long)ppuVar3 + -4);
      *(int *)((long)ppuVar3 + -4) = iVar11 + 1;
      ppuVar3[iVar11] = pbVar1;
      if (puVar21 == (uchar *)0x0) {
        puVar21 = (uchar *)0x0;
      }
      else {
        uVar6 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
        uVar6 = (uVar6 >> 5) + uVar6;
        uVar6 = uVar6 * 0x10 ^ uVar6;
        uVar6 = (uVar6 >> 0x11) + uVar6;
        ppuVar3 = hash_table[(ulong)((uVar6 >> 6) + uVar6 & 0x3fff) - 1];
        if (ppuVar3 == (uchar **)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(uint *)((long)ppuVar3 + -4);
        }
        if (0 < (int)uVar6) {
          uVar12 = (~uVar22 + data_len) - 1;
          if (0x100 < uVar12) {
            uVar12 = 0x101;
          }
          uVar18 = 0;
          do {
            if ((long)(int)(uVar22 - 0x7fff) < (long)ppuVar3[uVar18] - (long)data) {
              uVar17 = 0;
              if (0 < (int)(~uVar22 + data_len)) {
                do {
                  if (ppuVar3[uVar18][uVar17] != data[uVar17 + lVar13 + 1]) goto LAB_0010df9d;
                  uVar17 = uVar17 + 1;
                } while (uVar12 + 1 != uVar17);
                uVar17 = (ulong)(uVar12 + 1);
              }
LAB_0010df9d:
              if (iVar10 < (int)uVar17) {
                puVar21 = (uchar *)0x0;
                break;
              }
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar6);
        }
      }
      bVar8 = (byte)local_34;
      if (puVar21 == (uchar *)0x0) {
        bVar2 = *pbVar1;
        if (bVar2 < 0x90) {
          uVar6 = bVar2 + 0x30;
          iVar11 = 0;
          iVar10 = -8;
          do {
            iVar11 = (uVar6 & 1) + iVar11 * 2;
            uVar6 = uVar6 >> 1;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
          uVar6 = iVar11 << (bVar8 & 0x1f);
          local_34 = local_34 + 8;
        }
        else {
          uVar6 = bVar2 | 0x100;
          iVar11 = 0;
          iVar10 = -9;
          do {
            iVar11 = (uVar6 & 1) + iVar11 * 2;
            uVar6 = uVar6 >> 1;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
          uVar6 = iVar11 << (bVar8 & 0x1f);
          local_34 = local_34 + 9;
        }
        local_38 = local_38 | uVar6;
        iVar10 = 1;
LAB_0010e1bb:
        local_58 = stbiw__zlib_flushf(local_58,&local_38,&local_34);
      }
      else {
        iVar11 = (int)pbVar1 - (int)puVar21;
        if ((0x7fff < iVar11) || (0x102 < iVar10)) {
          local_40 = local_58;
          __assert_fail("d <= 32767 && best <= 258",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image_write.h"
                        ,0x20f,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)"
                       );
        }
        uVar18 = 0;
        do {
          uVar17 = uVar18;
          uVar18 = uVar17 + 1;
        } while ((int)(uint)stbi_zlib_compress::lengthc[uVar17 + 1] <= iVar10);
        if (uVar17 < 0x17) {
          iVar19 = 0;
          iVar9 = -7;
          do {
            iVar19 = ((uint)uVar18 & 1) + iVar19 * 2;
            uVar18 = (ulong)((uint)uVar18 >> 1);
            iVar9 = iVar9 + 1;
          } while (iVar9 != 0);
          uVar6 = iVar19 << (bVar8 & 0x1f);
          local_34 = local_34 + 7;
        }
        else {
          uVar6 = (int)uVar18 + 0xa8;
          iVar19 = 0;
          iVar9 = -8;
          do {
            iVar19 = (uVar6 & 1) + iVar19 * 2;
            uVar6 = uVar6 >> 1;
            iVar9 = iVar9 + 1;
          } while (iVar9 != 0);
          uVar6 = iVar19 << (bVar8 & 0x1f);
          local_34 = local_34 + 8;
        }
        local_38 = local_38 | uVar6;
        puVar21 = stbiw__zlib_flushf(local_58,&local_38,&local_34);
        uVar17 = uVar17 & 0xffffffff;
        if (0xffffffffffffffeb < uVar17 - 0x1c) {
          local_38 = local_38 |
                     iVar10 - (uint)stbi_zlib_compress::lengthc[uVar17] << ((byte)local_34 & 0x1f);
          local_34 = (uint)""[uVar17] + local_34;
          puVar21 = stbiw__zlib_flushf(puVar21,&local_38,&local_34);
        }
        uVar18 = 0xffffffffffffffff;
        do {
          lVar13 = uVar18 + 2;
          uVar18 = uVar18 + 1;
        } while ((int)(uint)stbi_zlib_compress::distc[lVar13] <= iVar11);
        iVar19 = 0;
        iVar9 = -5;
        uVar17 = uVar18 & 0xffffffff;
        do {
          iVar19 = ((uint)uVar17 & 1) + iVar19 * 2;
          uVar17 = uVar17 >> 1;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
        local_38 = local_38 | iVar19 << ((byte)local_34 & 0x1f);
        local_34 = local_34 + 5;
        local_58 = stbiw__zlib_flushf(puVar21,&local_38,&local_34);
        if (3 < uVar18) {
          local_38 = local_38 |
                     iVar11 - (uint)stbi_zlib_compress::distc[uVar18 & 0xffffffff] <<
                     ((byte)local_34 & 0x1f);
          local_34 = (uint)""[uVar18 & 0xffffffff] + local_34;
          goto LAB_0010e1bb;
        }
      }
      uVar22 = iVar10 + uVar22;
    } while ((int)uVar22 < data_len + -3);
  }
  local_40 = local_58;
  if ((int)uVar22 < data_len) {
    lVar13 = (long)(int)uVar22;
    do {
      bVar8 = data[lVar13];
      if (bVar8 < 0x90) {
        uVar22 = bVar8 + 0x30;
        iVar10 = 0;
        iVar11 = -8;
        do {
          iVar10 = (uVar22 & 1) + iVar10 * 2;
          uVar22 = uVar22 >> 1;
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0);
        uVar22 = iVar10 << ((byte)local_34 & 0x1f);
        local_34 = local_34 + 8;
      }
      else {
        uVar22 = bVar8 | 0x100;
        iVar10 = 0;
        iVar11 = -9;
        do {
          iVar10 = (uVar22 & 1) + iVar10 * 2;
          uVar22 = uVar22 >> 1;
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0);
        uVar22 = iVar10 << ((byte)local_34 & 0x1f);
        local_34 = local_34 + 9;
      }
      local_38 = local_38 | uVar22;
      local_58 = stbiw__zlib_flushf(local_58,&local_38,&local_34);
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != data_len);
  }
  local_34 = local_34 + 7;
  local_40 = local_58;
  puVar21 = stbiw__zlib_flushf(local_58,&local_38,&local_34);
  uVar14 = extraout_RDX;
  if (local_34 != 0) {
    do {
      local_34 = local_34 + 1;
      puVar21 = stbiw__zlib_flushf(puVar21,&local_38,&local_34);
      uVar14 = extraout_RDX_00;
    } while (local_34 != 0);
  }
  lVar13 = 0;
  local_40 = puVar21;
  do {
    if (hash_table[lVar13 + -1] != (uchar **)0x0) {
      free(hash_table[lVar13 + -1] + -1);
      uVar14 = extraout_RDX_01;
    }
    iVar10 = (int)uVar14;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x4000);
  if (data_len < 1) {
    uVar22 = 0;
    uVar6 = 1;
  }
  else {
    uVar12 = (uint)data_len % 0x15b0;
    uVar6 = 1;
    uVar15 = 0;
    iVar10 = -0x7ff87f8f;
    uVar22 = 0;
    do {
      if (uVar12 != 0) {
        uVar7 = (ulong)uVar12;
        uVar16 = uVar15;
        do {
          uVar6 = uVar6 + data[uVar16];
          uVar22 = uVar22 + uVar6;
          uVar16 = uVar16 + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        uVar6 = uVar6 % 0xfff1;
        uVar22 = uVar22 % 0xfff1;
      }
      uVar15 = uVar15 + uVar12;
      uVar12 = 0x15b0;
    } while ((int)uVar15 < data_len);
  }
  if ((puVar21 == (uchar *)0x0) || (*(int *)(puVar21 + -8) <= *(int *)(puVar21 + -4) + 1)) {
    stbiw__sbgrowf(&local_40,1,iVar10);
  }
  iVar10 = *(int *)(local_40 + -4);
  iVar11 = iVar10 + 1;
  *(int *)(local_40 + -4) = iVar11;
  local_40[iVar10] = (uchar)(uVar22 >> 8);
  if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1)) {
    stbiw__sbgrowf(&local_40,1,iVar11);
  }
  iVar10 = *(int *)(local_40 + -4);
  iVar11 = iVar10 + 1;
  *(int *)(local_40 + -4) = iVar11;
  local_40[iVar10] = (uchar)uVar22;
  if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1)) {
    stbiw__sbgrowf(&local_40,1,iVar11);
  }
  iVar10 = *(int *)(local_40 + -4);
  iVar11 = iVar10 + 1;
  *(int *)(local_40 + -4) = iVar11;
  local_40[iVar10] = (uchar)(uVar6 >> 8);
  if ((local_40 == (uchar *)0x0) || (*(int *)(local_40 + -8) <= *(int *)(local_40 + -4) + 1)) {
    stbiw__sbgrowf(&local_40,1,iVar11);
  }
  iVar10 = *(int *)(local_40 + -4);
  *(int *)(local_40 + -4) = iVar10 + 1;
  local_40[iVar10] = (uchar)uVar6;
  iVar10 = *(int *)(local_40 + -4);
  *out_len = iVar10;
  puVar21 = (uchar *)memmove(local_40 + -8,local_40,(long)iVar10);
  return puVar21;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char **hash_table[stbiw__ZHASH]; // 64KB on the stack!
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);

   {
      // compute adler32 on input
      unsigned int i=0, s1=1, s2=0, blocklen = data_len % 5552;
      int j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, (unsigned char) (s2 >> 8));
      stbiw__sbpush(out, (unsigned char) s2);
      stbiw__sbpush(out, (unsigned char) (s1 >> 8));
      stbiw__sbpush(out, (unsigned char) s1);
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}